

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

double __thiscall
imrt::EvaluationFunction::incremental_eval
          (EvaluationFunction *this,Station *station,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  list<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *plVar1;
  size_t *psVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  Matrix *pMVar6;
  _List_node_base *p_Var7;
  pointer piVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  _List_node_base *p_Var16;
  double local_80;
  
  this->prev_F = this->F;
  plVar1 = &this->Z_diff;
  p_Var7 = (this->Z_diff).
           super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var7 != (_List_node_base *)plVar1) {
    p_Var16 = p_Var7->_M_next;
    operator_delete(p_Var7);
    p_Var7 = p_Var16;
  }
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->Z_diff).
  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  ._M_impl._M_node._M_size = 0;
  if (this->nb_organs < 1) {
    local_80 = 0.0;
  }
  else {
    uVar9 = 0;
    local_80 = 0.0;
    do {
      pMVar6 = Station::getDepositionMatrix(station,(int)uVar9);
      piVar8 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (ulong)(uint)piVar8[uVar9];
      if (0 < piVar8[uVar9]) {
        lVar11 = 0;
        do {
          p_Var7 = (diff->
                   super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next;
          if (p_Var7 != (_List_node_base *)diff) {
            p_Var16 = (_List_node_base *)0x0;
            do {
              uVar12 = -(ulong)(pMVar6->p[lVar11][*(int *)&p_Var7[1]._M_next] == 0.0);
              p_Var16 = (_List_node_base *)
                        (uVar12 & (ulong)p_Var16 |
                        ~uVar12 & (ulong)((double)p_Var7[1]._M_prev *
                                          pMVar6->p[lVar11][*(int *)&p_Var7[1]._M_next] +
                                         (double)p_Var16));
              p_Var7 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            } while (p_Var7 != (_List_node_base *)diff);
            if (((double)p_Var16 != 0.0) || (NAN((double)p_Var16))) {
              lVar5 = *(long *)&(this->Z).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data;
              dVar14 = *(double *)(lVar5 + lVar11 * 8);
              dVar3 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar9];
              dVar13 = (double)p_Var16 + dVar14;
              if (dVar3 <= dVar14) {
                dVar15 = 0.0;
                if (dVar13 < dVar3) {
                  dVar15 = (dVar3 - dVar13) * (dVar3 - dVar13) *
                           (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar9] + 0.0;
                }
              }
              else {
                dVar15 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar9];
                if (dVar3 <= dVar13) {
                  dVar15 = 0.0 - dVar15 * (dVar3 - dVar14) * (dVar3 - dVar14);
                }
                else {
                  dVar15 = ((dVar14 - dVar3) + (dVar14 - dVar3) + (double)p_Var16) *
                           dVar15 * (double)p_Var16 + 0.0;
                }
              }
              dVar3 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar9];
              if (dVar14 <= dVar3) {
                if (dVar3 < dVar13) {
                  dVar14 = (dVar13 - dVar3) * (dVar13 - dVar3) *
                           (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar9];
                  goto LAB_001297fb;
                }
              }
              else {
                dVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar9];
                dVar14 = dVar14 - dVar3;
                if (dVar13 <= dVar3) {
                  dVar15 = dVar15 - dVar4 * dVar14 * dVar14;
                }
                else {
                  dVar14 = (dVar14 + dVar14 + (double)p_Var16) * dVar4 * (double)p_Var16;
LAB_001297fb:
                  dVar15 = dVar15 + dVar14;
                }
              }
              local_80 = local_80 + dVar15 / (double)(int)uVar10;
              *(double *)(lVar5 + lVar11 * 8) = dVar13;
              update_sorted_voxels(this,w,Zmin,Zmax,(int)uVar9,(int)lVar11);
              p_Var7 = (_List_node_base *)operator_new(0x20);
              p_Var7[1]._M_next = (_List_node_base *)(lVar11 << 0x20 | uVar9);
              p_Var7[1]._M_prev = p_Var16;
              std::__detail::_List_node_base::_M_hook(p_Var7);
              psVar2 = &(this->Z_diff).
                        super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                        ._M_impl._M_node._M_size;
              *psVar2 = *psVar2 + 1;
              piVar8 = (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            }
          }
          lVar11 = lVar11 + 1;
          uVar10 = (ulong)piVar8[uVar9];
        } while (lVar11 < (long)uVar10);
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)this->nb_organs);
  }
  local_80 = local_80 + this->F;
  this->F = local_80;
  n_evaluations = n_evaluations + 1;
  return local_80;
}

Assistant:

double EvaluationFunction::incremental_eval(Station& station, vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, list< pair< int, double > >& diff){

  prev_F=F; Z_diff.clear();
  double delta_F=0.0;

  //for each voxel we compute the change produced by the modified beamlets
  //while at the same time we compute the variation in the function F produced by all these changes

  for(int o=0; o<nb_organs; o++){
		const Matrix&  Dep = station.getDepositionMatrix(o);
		for(int k=0; k<nb_voxels[o]; k++){

		//we compute the change in the delivered dose in voxel k of the organ o
		double delta=0.0;

		//cout << station.changed_lets.size() << endl;
		for (auto let:diff){
		    int b=let.first;
			  if(Dep(k,b)==0.0) continue;
				delta+= Dep(k,b)*let.second;
		}


		if(delta==0.0) continue; //no change in the voxel


		double pen=0.0;
		//with the change in the dose of a voxel we can incrementally modify the value of F
		if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
		else if(Z[o][k] < Zmin[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
		else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

		if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
			pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
		else if(Z[o][k] > Zmax[o]) //the penalty disappears
			pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
		else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
			pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

		delta_F += pen/nb_voxels[o];
		Z[o][k] += delta;

    double prev_Dok=D[o][k];
		update_sorted_voxels(w, Zmin, Zmax, o, k);
		//update_beamlets_impact(o, k, prev_Dok);

		//we save the last changes (see undo_last_eval)
		Z_diff.push_back(make_pair(make_pair(o,k),delta));
	}
  }

  F+=delta_F;
  n_evaluations++;
  return F;

}